

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O1

void arena_decay_to_limit
               (tsdn_t *tsdn,arena_t *arena,arena_decay_t *decay,extents_t *extents,_Bool all,
               size_t npages_limit,size_t npages_decay_max,_Bool is_background_thread)

{
  arena_stats_u64_t *paVar1;
  uint64_t *puVar2;
  witness_t **ppwVar3;
  extent_t *peVar4;
  arena_decay_t *paVar5;
  _Bool _Var6;
  extent_state_t eVar7;
  int iVar8;
  extent_t *peVar9;
  long lVar10;
  mutex_prof_data_t *data;
  extent_t *extent;
  undefined7 in_register_00000081;
  long lVar11;
  ulong uVar12;
  long lVar13;
  bool bVar14;
  extent_hooks_t *local_78;
  undefined4 local_6c;
  arena_decay_t *local_68;
  long local_60;
  extents_t *local_58;
  arena_decay_t *local_50;
  extents_t *local_48;
  pthread_mutex_t *local_40;
  ssize_t local_38;
  
  local_6c = (undefined4)CONCAT71(in_register_00000081,all);
  if (decay->purging == false) {
    decay->purging = true;
    (decay->mtx).field_0.field_0.locked.repr = false;
    local_40 = (pthread_mutex_t *)((long)&(decay->mtx).field_0 + 0x40);
    local_68 = decay;
    local_58 = extents;
    pthread_mutex_unlock(local_40);
    local_78 = extent_hooks_get(arena);
    if (npages_decay_max == 0) {
      bVar14 = true;
      extent = (extent_t *)0x0;
    }
    else {
      extent = (extent_t *)0x0;
      uVar12 = 0;
      do {
        peVar9 = extents_evict(tsdn,arena,&local_78,local_58,npages_limit);
        if (peVar9 == (extent_t *)0x0) break;
        if (extent != (extent_t *)0x0) {
          peVar4 = (extent->ql_link).qre_prev;
          (peVar9->ql_link).qre_prev = peVar4;
          (peVar9->ql_link).qre_next = extent;
          (peVar4->ql_link).qre_next = peVar9;
          (extent->ql_link).qre_prev = peVar9;
        }
        extent = (peVar9->ql_link).qre_next;
        uVar12 = uVar12 + ((peVar9->field_2).e_size_esn >> 0xc);
      } while (uVar12 < npages_decay_max);
      bVar14 = uVar12 == 0;
    }
    if (!bVar14) {
      local_38 = (arena->decay_muzzy).time_ms.repr;
      if (extent == (extent_t *)0x0) {
        lVar13 = 0;
        lVar10 = 0;
        lVar11 = 0;
      }
      else {
        local_48 = &arena->extents_muzzy;
        local_50 = &arena->decay_dirty;
        lVar11 = 0;
        local_60 = 0;
        lVar13 = 0;
        do {
          uVar12 = (extent->field_2).e_size_esn;
          peVar9 = (extent->ql_link).qre_next;
          if (peVar9 == extent) {
            peVar9 = (extent_t *)0x0;
          }
          else {
            peVar4 = (extent->ql_link).qre_prev;
            (peVar4->ql_link).qre_next = (extent->ql_link).qre_next;
            (((extent->ql_link).qre_next)->ql_link).qre_prev = peVar4;
            (extent->ql_link).qre_next = extent;
            (extent->ql_link).qre_prev = extent;
          }
          uVar12 = uVar12 >> 0xc;
          eVar7 = extents_state_get(local_58);
          if (((eVar7 == extent_state_muzzy) || ((char)local_6c != '\0')) || (local_38 == 0)) {
LAB_00119681:
            extent_dalloc_wrapper(tsdn,arena,&local_78,extent);
            local_60 = local_60 + uVar12;
          }
          else {
            _Var6 = extent_purge_lazy_wrapper
                              (tsdn,arena,&local_78,extent,0,
                               (extent->field_2).e_size_esn & 0xfffffffffffff000);
            if (_Var6) goto LAB_00119681;
            extents_dalloc(tsdn,arena,&local_78,local_48,extent);
            if ((((~background_thread_enabled_state.repr | is_background_thread) & 1U) == 0) &&
               ((background_thread_info[(ulong)arena->base->ind % max_background_threads].
                 indefinite_sleep.repr & 1U) != 0)) {
              background_thread_interval_check(tsdn,arena,local_50,0);
            }
          }
          lVar13 = lVar13 + uVar12;
          lVar11 = lVar11 + 1;
          extent = peVar9;
        } while (peVar9 != (extent_t *)0x0);
        lVar10 = local_60 << 0xc;
      }
      LOCK();
      (local_68->stats->npurge).repr = (local_68->stats->npurge).repr + 1;
      UNLOCK();
      LOCK();
      paVar1 = &local_68->stats->nmadvise;
      paVar1->repr = paVar1->repr + lVar11;
      UNLOCK();
      LOCK();
      paVar1 = &local_68->stats->purged;
      paVar1->repr = paVar1->repr + lVar13;
      UNLOCK();
      LOCK();
      (arena->stats).mapped.repr = (arena->stats).mapped.repr - lVar10;
      UNLOCK();
    }
    iVar8 = pthread_mutex_trylock(local_40);
    paVar5 = local_68;
    if (iVar8 != 0) {
      malloc_mutex_lock_slow(&local_68->mtx);
      (paVar5->mtx).field_0.field_0.locked.repr = true;
    }
    puVar2 = &(paVar5->mtx).field_0.field_0.prof_data.n_lock_ops;
    *puVar2 = *puVar2 + 1;
    if ((paVar5->mtx).field_0.field_0.prof_data.prev_owner != tsdn) {
      (paVar5->mtx).field_0.field_0.prof_data.prev_owner = tsdn;
      ppwVar3 = &(paVar5->mtx).field_0.witness.link.qre_prev;
      *ppwVar3 = (witness_t *)((long)&(*ppwVar3)->name + 1);
    }
    paVar5->purging = false;
  }
  return;
}

Assistant:

static void
arena_decay_to_limit(tsdn_t *tsdn, arena_t *arena, arena_decay_t *decay,
    extents_t *extents, bool all, size_t npages_limit, size_t npages_decay_max,
    bool is_background_thread) {
	witness_assert_depth_to_rank(tsdn_witness_tsdp_get(tsdn),
	    WITNESS_RANK_CORE, 1);
	malloc_mutex_assert_owner(tsdn, &decay->mtx);

	if (decay->purging) {
		return;
	}
	decay->purging = true;
	malloc_mutex_unlock(tsdn, &decay->mtx);

	extent_hooks_t *extent_hooks = extent_hooks_get(arena);

	extent_list_t decay_extents;
	extent_list_init(&decay_extents);

	size_t npurge = arena_stash_decayed(tsdn, arena, &extent_hooks, extents,
	    npages_limit, npages_decay_max, &decay_extents);
	if (npurge != 0) {
		size_t npurged = arena_decay_stashed(tsdn, arena,
		    &extent_hooks, decay, extents, all, &decay_extents,
		    is_background_thread);
		assert(npurged == npurge);
	}

	malloc_mutex_lock(tsdn, &decay->mtx);
	decay->purging = false;
}